

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O3

address_type * __thiscall
cppcms::forwarder::check_forwading_rules
          (address_type *__return_storage_ptr__,forwarder *this,string *h,string *s,string *p)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  booster::shared_mutex::shared_lock();
  p_Var2 = (this->rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->rules_)._M_t._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
      *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
           CONCAT17(local_58._7_1_,CONCAT61(local_58._1_6_,local_58.first));
      *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
           CONCAT71(local_58.second._M_dataplus._M_p._0_7_,local_58._7_1_);
      (__return_storage_ptr__->first)._M_string_length = 0;
      __return_storage_ptr__->second = 0;
LAB_00207bbb:
      booster::shared_mutex::unlock();
      return __return_storage_ptr__;
    }
    mount_point::match(&local_58,*(mount_point **)(p_Var2 + 1),h,s,p);
    bVar1 = local_58.first;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT17(local_58.second._M_dataplus._M_p._7_1_,local_58.second._M_dataplus._M_p._0_7_)
        != &local_58.second.field_2) {
      operator_delete((undefined1 *)
                      CONCAT17(local_58.second._M_dataplus._M_p._7_1_,
                               local_58.second._M_dataplus._M_p._0_7_));
    }
    if (bVar1 != false) {
      (__return_storage_ptr__->first)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->first).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var2[1]._M_left,
                 (long)&(p_Var2[1]._M_left)->_M_color + (long)&(p_Var2[1]._M_right)->_M_color);
      __return_storage_ptr__->second = *(int *)&p_Var2[2]._M_left;
      goto LAB_00207bbb;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

forwarder::address_type forwarder::check_forwading_rules(std::string const &h,std::string const &s,std::string const &p)
	{
		booster::shared_lock<booster::shared_mutex> lock(mutex_);
		for(rules_type::const_iterator it=rules_.begin();it!=rules_.end();++it) {
			if(it->first->match(h,s,p).first)
				return it->second;
		}
		return address_type(std::string(),0);
	}